

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

ecs_entity_t ecs_lookup_child(ecs_world_t *world,ecs_entity_t parent,char *name)

{
  uint uVar1;
  ecs_vector_t *vector;
  void *pvVar2;
  ecs_entity_t eVar3;
  ecs_entity_t eVar4;
  ulong uVar5;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,parent);
  eVar3 = 0;
  if (vector != (ecs_vector_t *)0x0) {
    uVar1 = ecs_vector_count(vector);
    pvVar2 = _ecs_vector_first(vector,8,0x10);
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = eVar3;
    }
    eVar4 = 0;
    do {
      if (uVar5 == eVar4) {
        return 0;
      }
      eVar3 = find_child_in_table(*(ecs_table_t **)((long)pvVar2 + eVar4 * 8),name);
      eVar4 = eVar4 + 1;
    } while (eVar3 == 0);
  }
  return eVar3;
}

Assistant:

ecs_entity_t ecs_lookup_child(
    ecs_world_t *world,
    ecs_entity_t parent,
    const char *name)
{
    ecs_entity_t result = 0;

    ecs_vector_t *child_tables = ecs_map_get_ptr(
        world->child_tables, ecs_vector_t*, parent);
    
    if (child_tables) {
        ecs_vector_each(child_tables, ecs_table_t*, table_ptr, {
            ecs_table_t *table = *table_ptr;
            result = find_child_in_table(table, name);
            if (result) {
                return result;
            }
        });
    }

    return result;
}